

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

StringPtrConvertResult __thiscall
absl::lts_20250127::str_format_internal::FormatConvertImpl
          (str_format_internal *this,char *v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatSinkImpl *__first;
  FormatConversionChar FVar1;
  ArgConvertResult<(absl::lts_20250127::FormatConversionCharSet)262144> AVar2;
  int iVar3;
  char *pcVar4;
  string_view local_88;
  char local_71;
  size_type local_70;
  size_t len;
  undefined1 local_5c [16];
  undefined1 local_4c [4];
  VoidPtr local_48 [2];
  FormatSinkImpl *local_38;
  FormatSinkImpl *sink_local;
  char *v_local;
  undefined1 local_20 [8];
  undefined1 local_18 [8];
  FormatConversionSpecImpl conv_local;
  
  local_38 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_);
  local_20._0_4_ = conv._0_4_;
  sink_local = (FormatSinkImpl *)this;
  v_local = v;
  local_18 = (undefined1  [8])v;
  conv_local._0_4_ = local_20._0_4_;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_18);
  if (FVar1 == 0x11) {
    VoidPtr::VoidPtr<const_char,_0UL>(local_48,(char *)sink_local);
    local_5c._8_8_ = local_18;
    local_4c[0] = conv_local.conv_;
    local_4c[1] = conv_local.flags_;
    local_4c[2] = conv_local.length_mod_;
    local_4c[3] = conv_local._3_1_;
    stack0xffffffffffffff9c = (char *)local_18;
    local_5c[0] = conv_local.conv_;
    local_5c[1] = conv_local.flags_;
    local_5c[2] = conv_local.length_mod_;
    local_5c[3] = conv_local._3_1_;
    conv_01.precision_._0_1_ = conv_local.conv_;
    conv_01.precision_._1_1_ = conv_local.flags_;
    conv_01.precision_._2_1_ = conv_local.length_mod_;
    conv_01.precision_._3_1_ = conv_local._3_1_;
    conv_01.conv_ = local_18[0];
    conv_01.flags_ = local_18[1];
    conv_01.length_mod_ = local_18[2];
    conv_01._3_1_ = local_18[3];
    conv_01.width_ = local_18._4_4_;
    AVar2 = FormatConvertImpl(local_48[0],conv_01,local_38);
    conv_local.width_._3_1_ = (bool)(AVar2.value & 1);
  }
  else {
    if (sink_local == (FormatSinkImpl *)0x0) {
      local_70 = 0;
    }
    else {
      iVar3 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)local_18);
      __first = sink_local;
      if (iVar3 < 0) {
        local_70 = strlen((char *)sink_local);
      }
      else {
        iVar3 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)local_18);
        local_71 = '\0';
        pcVar4 = std::find<char_const*,char>
                           ((char *)__first,__first->buf_ + (long)iVar3 + -0x20,&local_71);
        local_70 = (long)pcVar4 - (long)sink_local;
      }
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,(char *)sink_local,local_70);
    conv_00.precision_._0_1_ = conv_local.conv_;
    conv_00.precision_._1_1_ = conv_local.flags_;
    conv_00.precision_._2_1_ = conv_local.length_mod_;
    conv_00.precision_._3_1_ = conv_local._3_1_;
    conv_00.conv_ = local_18[0];
    conv_00.flags_ = local_18[1];
    conv_00.length_mod_ = local_18[2];
    conv_00._3_1_ = local_18[3];
    conv_00.width_ = local_18._4_4_;
    conv_local.width_._3_1_ = anon_unknown_53::ConvertStringArg(local_88,conv_00,local_38);
  }
  return (StringPtrConvertResult)conv_local.width_._3_1_;
}

Assistant:

StringPtrConvertResult FormatConvertImpl(const char* v,
                                         const FormatConversionSpecImpl conv,
                                         FormatSinkImpl* sink) {
  if (conv.conversion_char() == FormatConversionCharInternal::p)
    return {FormatConvertImpl(VoidPtr(v), conv, sink).value};
  size_t len;
  if (v == nullptr) {
    len = 0;
  } else if (conv.precision() < 0) {
    len = std::strlen(v);
  } else {
    // If precision is set, we look for the NUL-terminator on the valid range.
    len = static_cast<size_t>(std::find(v, v + conv.precision(), '\0') - v);
  }
  return {ConvertStringArg(string_view(v, len), conv, sink)};
}